

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O3

void stbi_decode_DXT_color_block(uchar *uncompressed,uchar *compressed)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uchar local_14 [6];
  undefined1 local_e;
  undefined1 local_d;
  uchar decode_colors [12];
  
  iVar2 = (uint)(compressed[1] >> 3) * 0xff;
  uVar3 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  iVar2 = (*(ushort *)compressed >> 5 & 0x3f) * 0xff;
  uVar4 = (iVar2 + 0x20U >> 6) + iVar2 + 0x20 >> 6;
  iVar2 = (*compressed & 0x1f) * 0xff;
  uVar5 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  local_14[0] = (uchar)uVar3;
  local_14[1] = (char)uVar4;
  local_14[2] = (char)uVar5;
  iVar2 = (uint)(compressed[3] >> 3) * 0xff;
  uVar9 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  iVar2 = (*(ushort *)(compressed + 2) >> 5 & 0x3f) * 0xff;
  uVar8 = (iVar2 + 0x20U >> 6) + iVar2 + 0x20 >> 6;
  iVar2 = ((byte)*(ushort *)(compressed + 2) & 0x1f) * 0xff;
  uVar7 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  local_14[3] = (char)uVar9;
  local_14[4] = (char)uVar8;
  local_14[5] = (char)uVar7;
  local_e = (char)((uVar9 + uVar3 * 2) / 3);
  local_d = (char)((uVar8 + uVar4 * 2) / 3);
  decode_colors[0] = (uchar)((uVar7 + uVar5 * 2) / 3);
  decode_colors[1] = (uchar)((uVar3 + uVar9 * 2) / 3);
  decode_colors[2] = (uchar)((uVar4 + uVar8 * 2) / 3);
  decode_colors[3] = (uchar)((uVar5 + uVar7 * 2) / 3);
  uVar3 = 0x20;
  uVar6 = 0xfffffffffffffffc;
  do {
    lVar1 = (ulong)(compressed[uVar3 >> 3] >> ((byte)uVar3 & 6) & 3) * 3;
    uVar3 = uVar3 + 2;
    uncompressed[uVar6 + 4] = local_14[lVar1];
    uncompressed[uVar6 + 5] = local_14[lVar1 + 1];
    uncompressed[uVar6 + 6] = local_14[lVar1 + 2];
    uVar6 = uVar6 + 4;
  } while (uVar6 < 0x3c);
  return;
}

Assistant:

void stbi_decode_DXT_color_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*3];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[3] = r;
	decode_colors[4] = g;
	decode_colors[5] = b;
	//	Like DXT1, but no choicees:
	//	no alpha, 2 interpolated colors
	decode_colors[6] = (2*decode_colors[0] + decode_colors[3]) / 3;
	decode_colors[7] = (2*decode_colors[1] + decode_colors[4]) / 3;
	decode_colors[8] = (2*decode_colors[2] + decode_colors[5]) / 3;
	decode_colors[9] = (decode_colors[0] + 2*decode_colors[3]) / 3;
	decode_colors[10] = (decode_colors[1] + 2*decode_colors[4]) / 3;
	decode_colors[11] = (decode_colors[2] + 2*decode_colors[5]) / 3;
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 3;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
	}
	//	done
}